

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

int __thiscall pbrt::AliasTable::Sample(AliasTable *this,Float u,Float *pdfOut,Float *uRemapped)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  int *piVar4;
  float *pfVar5;
  const_reference pvVar6;
  float *in_RDX;
  Float *in_RSI;
  vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_> *in_RDI;
  float in_XMM0_Da;
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  int alias;
  Float up;
  int offset;
  float local_48;
  int local_44;
  float local_40;
  float local_3c;
  float local_38;
  int local_34;
  int local_30;
  int local_2c;
  float *local_28;
  Float *local_20;
  float local_14;
  int local_4;
  
  auVar7 = in_ZMM1._0_16_;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_14 = in_XMM0_Da;
  sVar3 = pstd::
          vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
          size(in_RDI);
  auVar7 = vcvtusi2ss_avx512f(auVar7,sVar3);
  local_30 = (int)(in_XMM0_Da * auVar7._0_4_);
  sVar3 = pstd::
          vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
          size(in_RDI);
  local_34 = (int)sVar3 + -1;
  piVar4 = std::min<int>(&local_30,&local_34);
  local_2c = *piVar4;
  auVar7 = ZEXT416((uint)local_14);
  sVar3 = pstd::
          vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
          size(in_RDI);
  auVar7 = vcvtusi2ss_avx512f(auVar7,sVar3);
  auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)local_14),ZEXT416((uint)-(float)local_2c));
  local_3c = auVar7._0_4_;
  pfVar5 = std::min<float>(&local_3c,(float *)&OneMinusEpsilon);
  fVar1 = *pfVar5;
  local_38 = fVar1;
  pvVar6 = pstd::
           vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
           operator[](in_RDI,(long)local_2c);
  if (pvVar6->q <= fVar1) {
    pvVar6 = pstd::
             vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
             ::operator[](in_RDI,(long)local_2c);
    local_44 = pvVar6->alias;
    if (local_20 != (Float *)0x0) {
      pvVar6 = pstd::
               vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
               ::operator[](in_RDI,(long)local_44);
      *local_20 = pvVar6->pdf;
    }
    fVar1 = local_38;
    if (local_28 != (float *)0x0) {
      pvVar6 = pstd::
               vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
               ::operator[](in_RDI,(long)local_2c);
      fVar2 = pvVar6->q;
      pvVar6 = pstd::
               vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
               ::operator[](in_RDI,(long)local_2c);
      local_48 = (fVar1 - fVar2) / (1.0 - pvVar6->q);
      pfVar5 = std::min<float>(&local_48,(float *)&OneMinusEpsilon);
      *local_28 = *pfVar5;
    }
    local_4 = local_44;
  }
  else {
    if (local_20 != (Float *)0x0) {
      pvVar6 = pstd::
               vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
               ::operator[](in_RDI,(long)local_2c);
      *local_20 = pvVar6->pdf;
    }
    fVar1 = local_38;
    if (local_28 != (float *)0x0) {
      pvVar6 = pstd::
               vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
               ::operator[](in_RDI,(long)local_2c);
      local_40 = fVar1 / pvVar6->q;
      pfVar5 = std::min<float>(&local_40,(float *)&OneMinusEpsilon);
      *local_28 = *pfVar5;
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int AliasTable::Sample(Float u, Float *pdfOut, Float *uRemapped) const {
    // Compute alias table _offset_ and remapped random sample _up_
    int offset = std::min<int>(u * bins.size(), bins.size() - 1);
    Float up = std::min<Float>(u * bins.size() - offset, OneMinusEpsilon);

    if (up < bins[offset].q) {
        // Return sample for alias table at _offset_
        DCHECK_GT(bins[offset].pdf, 0);
        if (pdfOut)
            *pdfOut = bins[offset].pdf;
        if (uRemapped)
            *uRemapped = std::min<Float>(up / bins[offset].q, OneMinusEpsilon);
        return offset;

    } else {
        // Return sample for alias table at _alias[offset]_
        int alias = bins[offset].alias;
        DCHECK_GE(alias, 0);
        DCHECK_GT(bins[offset].pdf, 0);
        if (pdfOut)
            *pdfOut = bins[alias].pdf;
        if (uRemapped)
            *uRemapped = std::min<Float>((up - bins[offset].q) / (1 - bins[offset].q),
                                         OneMinusEpsilon);
        return alias;
    }
}